

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O2

int demoClose(unqlite_file *pFile)

{
  int iVar1;
  
  iVar1 = demoFlushBuffer((DemoFile *)pFile);
  unqlite_free(pFile[3].pMethods);
  close(*(int *)&pFile[2].pMethods);
  return iVar1;
}

Assistant:

static int demoClose(unqlite_file *pFile){
  int rc;
  DemoFile *p = (DemoFile*)pFile;
  rc = demoFlushBuffer(p);
  unqlite_free(p->aBuffer);
  close(p->fd);
  return rc;
}